

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O2

void server::duel_cmd(int cid,char **args,int argc)

{
  char *s;
  bool bVar1;
  int iVar2;
  clientinfo *ci;
  char **ppcVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  stringformatter local_140;
  string f;
  
  pcVar4 = args[1];
  s = args[2];
  bVar1 = QServ::getlastSA(&qs);
  if ((((bVar1) && (args[1] != (char *)0x0)) && (args[2] != (char *)0x0)) &&
     ((*s != '\0' && (*pcVar4 != '\0')))) {
    lVar5 = (long)mcduel;
    ppcVar3 = qserv_modenames;
    for (lVar6 = 0; lVar6 <= lVar5; lVar6 = lVar6 + 1) {
      iVar2 = strcmp(pcVar4,*ppcVar3);
      if (iVar2 == 0) {
        changemap(s,(int)lVar6);
        break;
      }
      ppcVar3 = ppcVar3 + 1;
    }
    bVar1 = QServ::getlastSA(&qs);
    if (bVar1 && lVar6 <= lVar5) {
      iVar2 = QServ::getSender(&qs);
      ci = QServ::getClient(&qs,iVar2);
      persist = 1;
      pausegame(true,ci);
      iVar2 = dueltimermillis;
      while ((iVar2 != 0 && (iVar2 <= dueltimermillis))) {
        out(3,"\f2Get ready! Starting duel in %d:%d",
            (long)((ulong)(uint)((int)((long)iVar2 / 1000) >> 0x1f) << 0x20 |
                  (long)iVar2 / 1000 & 0xffffffffU) % 1000 & 0xffffffff);
        iVar2 = iVar2 + -1;
      }
      pausegame(false,ci);
      local_140.buf = f;
      stringformatter::operator()
                (&local_140,"\f2Duel has started: %s on map %s. Good luck, have fun.",*ppcVar3,s);
      sendf(-1,1,"ris",0x23,f);
    }
    if (lVar6 <= lVar5) {
      return;
    }
    iVar2 = QServ::getSender(&qs);
    pcVar4 = "\f3Error: Unknown mode";
  }
  else {
    pcVar4 = f;
    local_140.buf = pcVar4;
    stringformatter::operator()(&local_140,"\f3Error: Invalid mode/mapname provided");
    iVar2 = QServ::getSender(&qs);
  }
  sendf(iVar2,1,"ris",0x23,pcVar4);
  return;
}

Assistant:

QSERV_CALLBACK duel_cmd(p) {
        const char *mapname = args[2];
        char *mn = args[1];
        if(CMD_SA && args[1] != NULL && args[2] != NULL && *mapname !=NULL && *mn!=NULL) {
            int gm; // default set to current mode td
            bool valid = false;
            
            // intialize this for perf
            for(int i = 0; i <= mcduel; i++)  {
                if(!strcmp(mn, qserv_modenames[i]))  {
                    gm = i;
                    // use other list to send full name of mode
                    changemap(mapname, gm);
                    valid = true;
                    break;
                }
            }
            if(CMD_SA && valid) {
                clientinfo *ci = qs.getClient(CMD_SENDER);
                server::persist = true;
                pausegame(true,ci);
                int dueltimer;
                for(dueltimer = dueltimermillis; dueltimer <= dueltimermillis && dueltimer != (0); --dueltimer) {
                    out(ECHO_SERV, "\f2Get ready! Starting duel in %d:%d",(dueltimer/1000) % 1000,dueltimer);
                }
                pausegame(false,ci);
                defformatstring(f)("\f2Duel has started: %s on map %s. Good luck, have fun.", qserv_modenames[gm], mapname);
                sendf(-1, 1, "ris", N_SERVMSG, f);
            }
            
            if(!valid) {sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Unknown mode");}
        }
        else {
            bool valid = false;
            defformatstring(f)("\f3Error: Invalid mode/mapname provided");
            sendf(CMD_SENDER, 1, "ris", N_SERVMSG, f);
        }
    }